

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_math_minmax(jit_State *J,RecordFFData *rd)

{
  uint32_t uVar1;
  TRef TVar2;
  TRef TVar3;
  TRef *pTVar4;
  ulong uVar5;
  ushort uVar6;
  
  TVar2 = lj_ir_tonumber(J,*J->base);
  pTVar4 = J->base;
  TVar3 = pTVar4[1];
  if (TVar3 != 0) {
    uVar1 = rd->data;
    uVar5 = 2;
    do {
      TVar3 = lj_ir_tonumber(J,TVar3);
      if ((TVar2 >> 0x18 & 0x1f) - 0xf < 5) {
        uVar6 = 0x13;
        if (4 < (TVar3 >> 0x18 & 0x1f) - 0xf) {
          (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
          TVar2 = lj_opt_fold(J);
          goto LAB_00139e09;
        }
      }
      else {
LAB_00139e09:
        uVar6 = 0xe;
        if ((TVar3 >> 0x18 & 0x1f) - 0xf < 5) {
          (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
          TVar3 = lj_opt_fold(J);
        }
      }
      (J->fold).ins.field_0.ot = uVar6 | (ushort)(uVar1 << 8);
      (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
      TVar2 = lj_opt_fold(J);
      pTVar4 = J->base;
      TVar3 = pTVar4[uVar5];
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (TVar3 != 0);
  }
  *pTVar4 = TVar2;
  return;
}

Assistant:

static void LJ_FASTCALL recff_math_minmax(jit_State *J, RecordFFData *rd)
{
  TRef tr = lj_ir_tonumber(J, J->base[0]);
  uint32_t op = rd->data;
  BCReg i;
  for (i = 1; J->base[i] != 0; i++) {
    TRef tr2 = lj_ir_tonumber(J, J->base[i]);
    IRType t = IRT_INT;
    if (!(tref_isinteger(tr) && tref_isinteger(tr2))) {
      if (tref_isinteger(tr)) tr = emitir(IRTN(IR_CONV), tr, IRCONV_NUM_INT);
      if (tref_isinteger(tr2)) tr2 = emitir(IRTN(IR_CONV), tr2, IRCONV_NUM_INT);
      t = IRT_NUM;
    }
    tr = emitir(IRT(op, t), tr, tr2);
  }
  J->base[0] = tr;
}